

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

bool __thiscall Token::operator==(Token *this,Token *rhs)

{
  bool bVar1;
  NumericConstant *rhs_00;
  Token *rhs_local;
  Token *this_local;
  
  if (this->mType == rhs->mType) {
    rhs_00 = numericValue(rhs);
    bVar1 = NumericConstant::operator!=(&this->mNumericValue,rhs_00);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else if (this->mCharValue == rhs->mCharValue) {
      if (this->mCharValue2 == rhs->mCharValue2) {
        bVar1 = std::operator!=(&this->mIdentifier,&rhs->mIdentifier);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Token::operator==(const Token& rhs) const {
	if (mType != rhs.mType) {
		return false;
	}

	if (mNumericValue != rhs.numericValue()) {
		return false;
	}

	if (mCharValue != rhs.mCharValue) {
		return false;
	}

	if (mCharValue2 != rhs.mCharValue2) {
		return false;
	}

	if (mIdentifier != rhs.mIdentifier) {
		return false;
	}

	return true;
}